

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.c
# Opt level: O1

void file_add(char *name)

{
  long lVar1;
  char *pcVar2;
  int iVar3;
  file_entry_s *pfVar4;
  size_t sVar5;
  char *pcVar6;
  long lVar7;
  filetype_t fVar8;
  bool bVar9;
  
  pfVar4 = (file_entry_s *)mmalloc(0x18);
  pfVar4->next = (file_entry_s *)0x0;
  cur->next = pfVar4;
  cur = pfVar4;
  sVar5 = strlen(name);
  pcVar6 = (char *)mmalloc(sVar5 + 1);
  (pfVar4->file).name = pcVar6;
  strcpy(pcVar6,name);
  pcVar6 = (pfVar4->file).name;
  lVar7 = 0;
  do {
    pcVar2 = pcVar6 + lVar7;
    lVar7 = lVar7 + 1;
  } while (*pcVar2 != '\0');
  do {
    lVar1 = lVar7 + -1;
    if (pcVar6[lVar7 + -1] == '.') break;
    bVar9 = lVar7 != 1;
    lVar7 = lVar1;
  } while (bVar9);
  pcVar6 = pcVar6 + lVar1;
  iVar3 = strcmp(pcVar6,".c");
  fVar8 = C;
  if ((iVar3 != 0) && (iVar3 = strcmp(pcVar6,".C"), fVar8 = C, iVar3 != 0)) {
    iVar3 = strcmp(pcVar6,".i");
    fVar8 = I;
    if ((iVar3 != 0) && (iVar3 = strcmp(pcVar6,".I"), iVar3 != 0)) {
      iVar3 = strcmp(pcVar6,".s");
      if (iVar3 == 0) {
        fVar8 = S;
      }
      else {
        iVar3 = strcmp(pcVar6,".S");
        fVar8 = O - (iVar3 == 0);
      }
    }
  }
  (pfVar4->file).type = fVar8;
  (pfVar4->file).tmp = 0;
  count = count + 1;
  return;
}

Assistant:

void file_add(const char* name)
{
    char* p;
    file_entry_t* nf = (file_entry_t*)mmalloc(sizeof(file_entry_t));
    nf->next = NULL;
    cur->next = nf;
    cur = cur->next;


    nf->file.name = (char*)mmalloc(strlen(name) + 1);
    strcpy(nf->file.name, name);
    p = nf->file.name;

    /* Find the file's type using its extension */
    while (*p)
        ++p;
    while (*p != '.' && p != nf->file.name)
        --p;

    if (strcmp(p, ".c") == 0 || strcmp(p, ".C") == 0)
        nf->file.type = C;
    else if (strcmp(p, ".i") == 0 || strcmp(p, ".I") == 0)
        nf->file.type = I;
    else if (strcmp(p, ".s") == 0 || strcmp(p, ".S") == 0)
        nf->file.type = S;
    else
        nf->file.type = O;

    nf->file.tmp = 0;
    ++count;
}